

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceDescriptors(Generator *this)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(this->file_ + 0x34); lVar1 = lVar1 + 1) {
    PrintServiceDescriptor(this,(ServiceDescriptor *)(*(long *)(this->file_ + 0x78) + lVar2));
    AddServiceToFileDescriptor(this,(ServiceDescriptor *)(*(long *)(this->file_ + 0x78) + lVar2));
    io::Printer::Print<>(this->printer_,"\n");
    lVar2 = lVar2 + 0x30;
  }
  return;
}

Assistant:

void Generator::PrintServiceDescriptors() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceDescriptor(*file_->service(i));
    AddServiceToFileDescriptor(*file_->service(i));
    printer_->Print("\n");
  }
}